

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O3

bool fs_is_removable(string_view path)

{
  string_view fname;
  error_code local_20;
  
  local_20._M_cat = (error_category *)std::_V2::generic_category();
  local_20._M_value = 0x26;
  fname._M_str = "fs_is_removable";
  fname._M_len = 0xf;
  fs_print_error(path,fname,&local_20);
  return false;
}

Assistant:

bool
fs_is_removable(std::string_view path)
{
  // is path a removable device like a USB stick or SD card or CD-ROM, DVD, Blu-ray
  // not a fixed disk like a hard drive or SSD
#if defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getdrivetypea
  UINT t = GetDriveTypeA(fs_root(path).data());
  switch (t)
  {
    case DRIVE_REMOVABLE:
    case DRIVE_CDROM:
      return true;
    case DRIVE_FIXED:
    case DRIVE_REMOTE:
    case DRIVE_RAMDISK:
      return false;
    case DRIVE_UNKNOWN:
    case DRIVE_NO_ROOT_DIR:
      fs_print_error(path, __func__, std::make_error_code(std::errc::no_such_device));
      return false;
    default:
      return false;
  }
#else
  // Linux: find the device and check /sys/block/*/removable == 1
  // macOS: check /Volumes/*/ for a removable device
  fs_print_error(path, __func__, std::make_error_code(std::errc::function_not_supported));
  return false;
#endif

}